

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# structure.c
# Opt level: O2

LY_ERR structure_aug_sprinter_ctree
                 (lysc_ext_instance *ext,lyspr_tree_ctx *ctx,char **flags,char **add_opts)

{
  lysp_ext_instance *ext_00;
  lysp_ext_instance *plVar1;
  int iVar2;
  LY_ERR LVar3;
  char **extraout_RDX;
  char **extraout_RDX_00;
  char **ppcVar4;
  lysp_ext_instance *plVar5;
  
  if (ctx == (lyspr_tree_ctx *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts/structure.c"
                  ,499,
                  "LY_ERR structure_aug_sprinter_ctree(struct lysc_ext_instance *, const struct lyspr_tree_ctx *, const char **, const char **)"
                 );
  }
  ext_00 = ext->module->parsed->exts;
  ppcVar4 = &ext_00->argument;
  plVar5 = (lysp_ext_instance *)0x0;
  do {
    if (ext_00 == (lysp_ext_instance *)0x0) {
LAB_0019776c:
      __assert_fail("i < LY_ARRAY_COUNT(parsed_ext)",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/plugins_exts/structure.c"
                    ,0x1fc,
                    "LY_ERR structure_aug_sprinter_ctree(struct lysc_ext_instance *, const struct lyspr_tree_ctx *, const char **, const char **)"
                   );
    }
    plVar1 = ext_00[-1].exts;
    if (plVar1 <= plVar5) {
LAB_00197750:
      if (plVar5 < plVar1) {
        LVar3 = structure_aug_sprinter_ptree(ext_00,ctx,flags,add_opts);
        return LVar3;
      }
      goto LAB_0019776c;
    }
    iVar2 = strcmp(((lysp_ext_instance *)(ppcVar4 + -1))->name,"sx:augment-structure");
    flags = extraout_RDX;
    if (iVar2 == 0) {
      iVar2 = strcmp(*ppcVar4,ext->argument);
      flags = extraout_RDX_00;
      if (iVar2 == 0) goto LAB_00197750;
    }
    plVar5 = (lysp_ext_instance *)((long)&plVar5->name + 1);
    ppcVar4 = ppcVar4 + 0xe;
  } while( true );
}

Assistant:

static LY_ERR
structure_aug_sprinter_ctree(struct lysc_ext_instance *ext, const struct lyspr_tree_ctx *ctx, const char **flags,
        const char **add_opts)
{
    LY_ERR rc = LY_SUCCESS;

    LY_ARRAY_COUNT_TYPE i;
    struct lysp_ext_instance *parsed_ext;

    assert(ctx);

    /* find the parsed ext structure */
    parsed_ext = ext->module->parsed->exts;
    LY_ARRAY_FOR(parsed_ext, i) {
        if (!strcmp(parsed_ext[i].name, "sx:augment-structure") && !strcmp(parsed_ext[i].argument, ext->argument)) {
            break;
        }
    }
    assert(i < LY_ARRAY_COUNT(parsed_ext));

    /* for augments print the parsed tree */
    rc = structure_aug_sprinter_ptree(parsed_ext, ctx, flags, add_opts);
    return rc;
}